

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsCreateCustomExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsGetterSetterInterceptor **getterSetterInterceptor,
          JsValueRef prototype,JsValueRef *object)

{
  anon_class_56_7_71cf8468 fn;
  JsErrorCode JVar1;
  JsValueRef local_38;
  JsValueRef prototype_local;
  JsGetterSetterInterceptor **getterSetterInterceptor_local;
  JsFinalizeCallback finalizeCallback_local;
  JsTraceCallback traceCallback_local;
  size_t inlineSlotSize_local;
  void *data_local;
  
  fn.object = &object;
  fn.prototype = &local_38;
  fn.inlineSlotSize = (size_t *)&traceCallback_local;
  fn.data = (void **)&inlineSlotSize_local;
  fn.traceCallback = &finalizeCallback_local;
  fn.finalizeCallback = (JsFinalizeCallback *)&getterSetterInterceptor_local;
  fn.getterSetterInterceptor = (JsGetterSetterInterceptor ***)&prototype_local;
  local_38 = prototype;
  prototype_local = getterSetterInterceptor;
  getterSetterInterceptor_local = (JsGetterSetterInterceptor **)finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local = (JsTraceCallback)inlineSlotSize;
  inlineSlotSize_local = (size_t)data;
  JVar1 = ContextAPINoScriptWrapper<JsCreateCustomExternalObject::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateCustomExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _Inout_opt_ JsGetterSetterInterceptor ** getterSetterInterceptor,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef * object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }

        Js::JsGetterSetterInterceptor * interceptor = nullptr;
        *object = Js::CustomExternalWrapperObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, &interceptor, prototypeObject, scriptContext);
        Assert(interceptor);
        *getterSetterInterceptor = reinterpret_cast<JsGetterSetterInterceptor*>(interceptor);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}